

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

void __thiscall CGraphics_Threaded::LinesDraw(CGraphics_Threaded *this,CLineItem *pArray,int Num)

{
  CColor *pCVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/client/graphics_threaded.cpp"
                 ,0xfb,(uint)(this->m_Drawing == 2),"called Graphics()->LinesDraw without begin");
  uVar6 = 0;
  iVar7 = 0;
  if (0 < Num) {
    iVar7 = Num;
  }
  for (; (uint)(iVar7 * 2) != uVar6; uVar6 = uVar6 + 2) {
    iVar8 = this->m_NumVertices;
    iVar2 = (int)uVar6;
    iVar9 = iVar2 + iVar8;
    this->m_aVertices[iVar9].m_Pos = *(CPoint *)(&pArray->m_X0 + uVar6 * 2);
    this->m_aVertices[iVar9].m_Tex.i = this->m_aTexture[0].i;
    fVar3 = this->m_aTexture[0].v;
    this->m_aVertices[iVar9].m_Tex.u = this->m_aTexture[0].u;
    this->m_aVertices[iVar9].m_Tex.v = fVar3;
    fVar3 = this->m_aColor[0].g;
    fVar4 = this->m_aColor[0].b;
    fVar5 = this->m_aColor[0].a;
    pCVar1 = &this->m_aVertices[iVar9].m_Color;
    pCVar1->r = this->m_aColor[0].r;
    pCVar1->g = fVar3;
    pCVar1->b = fVar4;
    pCVar1->a = fVar5;
    iVar8 = iVar8 + iVar2 + 1;
    this->m_aVertices[iVar8].m_Pos = *(CPoint *)(&pArray->m_X1 + uVar6 * 2);
    fVar3 = this->m_aTexture[1].v;
    this->m_aVertices[iVar8].m_Tex.u = this->m_aTexture[1].u;
    this->m_aVertices[iVar8].m_Tex.v = fVar3;
    this->m_aVertices[iVar8].m_Tex.i = this->m_aTexture[1].i;
    fVar3 = this->m_aColor[1].g;
    fVar4 = this->m_aColor[1].b;
    fVar5 = this->m_aColor[1].a;
    pCVar1 = &this->m_aVertices[this->m_NumVertices + iVar2 + 1].m_Color;
    pCVar1->r = this->m_aColor[1].r;
    pCVar1->g = fVar3;
    pCVar1->b = fVar4;
    pCVar1->a = fVar5;
  }
  AddVertices(this,Num * 2);
  return;
}

Assistant:

void CGraphics_Threaded::LinesDraw(const CLineItem *pArray, int Num)
{
	dbg_assert(m_Drawing == DRAWING_LINES, "called Graphics()->LinesDraw without begin");

	for(int i = 0; i < Num; ++i)
	{
		m_aVertices[m_NumVertices + 2*i].m_Pos.x = pArray[i].m_X0;
		m_aVertices[m_NumVertices + 2*i].m_Pos.y = pArray[i].m_Y0;
		m_aVertices[m_NumVertices + 2*i].m_Tex = m_aTexture[0];
		m_aVertices[m_NumVertices + 2*i].m_Color = m_aColor[0];

		m_aVertices[m_NumVertices + 2*i + 1].m_Pos.x = pArray[i].m_X1;
		m_aVertices[m_NumVertices + 2*i + 1].m_Pos.y = pArray[i].m_Y1;
		m_aVertices[m_NumVertices + 2*i + 1].m_Tex = m_aTexture[1];
		m_aVertices[m_NumVertices + 2*i + 1].m_Color = m_aColor[1];
	}

	AddVertices(2*Num);
}